

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

D_Pass * find_pass(Grammar *g,char *start,char *end)

{
  D_Pass **ppDVar1;
  D_Pass *pDVar2;
  int iVar3;
  ushort **ppuVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  
  bVar5 = *start;
  if (bVar5 != 0) {
    ppuVar4 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar4 + (ulong)bVar5 * 2 + 1) & 0x20) == 0) break;
      bVar5 = start[1];
      start = start + 1;
    } while (bVar5 != 0);
  }
  uVar6 = (ulong)(g->passes).n;
  if (uVar6 != 0) {
    ppDVar1 = (g->passes).v;
    uVar7 = 0;
    do {
      pDVar2 = ppDVar1[uVar7];
      if ((pDVar2->name_len == (uint)((long)end - (long)start)) &&
         (iVar3 = strncmp(pDVar2->name,start,(long)end - (long)start & 0xffffffff), iVar3 == 0)) {
        return pDVar2;
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  return (D_Pass *)0x0;
}

Assistant:

D_Pass *find_pass(Grammar *g, char *start, char *end) {
  uint i, l;
  while (*start && isspace_(*start)) start++;
  l = end - start;
  for (i = 0; i < g->passes.n; i++)
    if (l == g->passes.v[i]->name_len && !strncmp(g->passes.v[i]->name, start, l)) return g->passes.v[i];
  return NULL;
}